

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT32_Unmarshal(&target->count,buffer,size);
  if (TVar1 == 0) {
    TVar1 = 0x84;
    if (target->count < 0xf) {
      TVar1 = TPMS_TAGGED_POLICY_Array_Unmarshal(target->policies,buffer,size,target->count);
      return TVar1;
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_TAGGED_POLICIES)
        return TPM_RC_VALUE;
    result = TPMS_TAGGED_POLICY_Array_Unmarshal((TPMS_TAGGED_POLICY *)(target->policies), buffer, size, (INT32)(target->count));
    return result;
}